

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsGearbox.cpp
# Opt level: O2

void __thiscall chrono::ChShaftsGearbox::ChShaftsGearbox(ChShaftsGearbox *this)

{
  double dVar1;
  
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChShaftsGearbox_0116e350
  ;
  this->r1 = 1.0;
  this->r2 = 1.0;
  this->r3 = 1.0;
  this->torque_react = 0.0;
  ChConstraintThreeGeneric::ChConstraintThreeGeneric(&this->constraint);
  this->body = (ChBodyFrame *)0x0;
  this->shaft1 = (ChShaft *)0x0;
  this->shaft2 = (ChShaft *)0x0;
  dVar1 = DAT_011dd3f8;
  (this->shaft_dir).m_data[0] = VECT_X;
  (this->shaft_dir).m_data[1] = dVar1;
  (this->shaft_dir).m_data[2] = DAT_011dd400;
  this->r3 = 0.5;
  this->r1 = 0.5;
  this->r2 = (double)&DAT_bff0000000000000;
  return;
}

Assistant:

ChShaftsGearbox::ChShaftsGearbox()
    : r1(1), r2(1), r3(1), torque_react(0), shaft1(NULL), shaft2(NULL), body(NULL), shaft_dir(VECT_X) {
    SetTransmissionRatio(0.5);
}